

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalMap.c
# Opt level: O2

void Gia_ManPrepareWin(Gia_Man_t *p,Vec_Int_t *vOuts,Vec_Int_t **pvPis,Vec_Int_t **pvPos,
                      Vec_Int_t **pvAnds,int fPoOnly)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  Vec_Int_t *pVVar5;
  Vec_Int_t **ppVVar6;
  int iVar7;
  Gia_Man_t *pGVar8;
  
  Gia_ManIncrementTravId(p);
  for (iVar7 = 0; iVar7 < vOuts->nSize; iVar7 = iVar7 + 1) {
    iVar1 = Vec_IntEntry(vOuts,iVar7);
    pGVar3 = Gia_ManCo(p,iVar1);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    iVar1 = Gia_ObjFaninId0p(p,pGVar3);
    Gia_ManHighlight_rec(p,iVar1);
  }
  pGVar8 = p;
  Gia_ManCleanMark0(p);
  if (fPoOnly == 0) {
    iVar7 = 1;
    while( true ) {
      iVar1 = (int)pGVar8;
      if (p->nObjs <= iVar7) break;
      pGVar8 = p;
      pGVar3 = Gia_ManObj(p,iVar7);
      iVar1 = (int)pGVar8;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar2 = (uint)*(ulong *)pGVar3;
      if ((uVar2 & 0x9fffffff) != 0x9fffffff) {
        uVar4 = *(ulong *)pGVar3 & 0x1fffffff;
        if (uVar4 != 0x1fffffff && -1 < (int)uVar2) {
          pGVar8 = p;
          iVar1 = Gia_ObjIsTravIdCurrentId(p,iVar7);
          if (iVar1 == 0) goto LAB_005abaca;
          uVar4 = (ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff);
        }
        pGVar3[-uVar4].field_0x3 = pGVar3[-uVar4].field_0x3 | 0x40;
        uVar2 = (uint)*(undefined8 *)pGVar3;
        if ((~uVar2 & 0x1fffffff) != 0 && -1 < (int)uVar2) {
          pGVar3[-(ulong)((uint)((ulong)*(undefined8 *)pGVar3 >> 0x20) & 0x1fffffff)].field_0x3 =
               pGVar3[-(ulong)((uint)((ulong)*(undefined8 *)pGVar3 >> 0x20) & 0x1fffffff)].field_0x3
               | 0x40;
        }
      }
LAB_005abaca:
      iVar7 = iVar7 + 1;
    }
  }
  else {
    for (iVar7 = 0; iVar1 = (int)pGVar8, iVar7 < vOuts->nSize; iVar7 = iVar7 + 1) {
      iVar1 = Vec_IntEntry(vOuts,iVar7);
      pGVar8 = p;
      pGVar3 = Gia_ManCo(p,iVar1);
      iVar1 = (int)pGVar8;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      *(ulong *)(pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)) =
           *(ulong *)(pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)) | 0x40000000;
    }
  }
  pVVar5 = Vec_IntAlloc(iVar1);
  *pvPis = pVVar5;
  pVVar5 = Vec_IntAlloc(iVar1);
  *pvPos = pVVar5;
  pVVar5 = Vec_IntAlloc(iVar1);
  *pvAnds = pVVar5;
  for (iVar7 = 1; iVar7 < p->nObjs; iVar7 = iVar7 + 1) {
    pGVar3 = Gia_ManObj(p,iVar7);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    iVar1 = Gia_ObjIsTravIdCurrentId(p,iVar7);
    if (iVar1 != 0) {
      ppVVar6 = pvPis;
      if ((((uint)*(undefined8 *)pGVar3 & 0x9fffffff) == 0x9fffffff) ||
         (ppVVar6 = pvPos, ((uint)*(undefined8 *)pGVar3 >> 0x1e & 1) != 0)) {
        Vec_IntPush(*ppVVar6,iVar7);
      }
      if ((~*(uint *)pGVar3 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar3) {
        Vec_IntPush(*pvAnds,iVar7);
      }
    }
  }
  Gia_ManCleanMark0(p);
  return;
}

Assistant:

void Gia_ManPrepareWin( Gia_Man_t * p, Vec_Int_t * vOuts, Vec_Int_t ** pvPis, Vec_Int_t ** pvPos, Vec_Int_t ** pvAnds, int fPoOnly )
{
    Gia_Obj_t * pObj;
    int i;
    // mark the section
    Gia_ManIncrementTravId( p );
    Gia_ManForEachCoVec( vOuts, p, pObj, i )
        Gia_ManHighlight_rec( p, Gia_ObjFaninId0p(p, pObj) );
    // mark fanins of the outside area
    Gia_ManCleanMark0( p );
    if ( fPoOnly )
    {
        Gia_ManForEachCoVec( vOuts, p, pObj, i )
            Gia_ObjFanin0(pObj)->fMark0 = 1;
    }
    else
    {
        Gia_ManForEachObj1( p, pObj, i )
        {
            if ( Gia_ObjIsCi(pObj) )
                continue;
            if ( Gia_ObjIsAnd(pObj) && !Gia_ObjIsTravIdCurrentId(p, i) )
                continue;
            Gia_ObjFanin0(pObj)->fMark0 = 1;
            if ( Gia_ObjIsAnd(pObj) )
                Gia_ObjFanin1(pObj)->fMark0 = 1;
        }
    }
    // collect pointed nodes
    *pvPis  = Vec_IntAlloc( 1000 );
    *pvPos  = Vec_IntAlloc( 1000 );
    *pvAnds = Vec_IntAlloc( 1000 );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( !Gia_ObjIsTravIdCurrentId(p, i) )
            continue;
        if ( Gia_ObjIsCi(pObj) )
            Vec_IntPush( *pvPis, i );
        else if ( pObj->fMark0 )
            Vec_IntPush( *pvPos, i );
        if ( Gia_ObjIsAnd(pObj) )
            Vec_IntPush( *pvAnds, i );
    }
    Gia_ManCleanMark0( p );
}